

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_descent_parser.cpp
# Opt level: O1

JsonValue * __thiscall MercuryJson::JSON::_parse_value(JSON *this)

{
  byte encountered;
  ulong *puVar1;
  ulong offset;
  char *s;
  bool args;
  undefined8 in_RAX;
  longlong args_00;
  JsonValue *pJVar2;
  runtime_error *this_00;
  double args_01;
  bool is_decimal;
  bool local_11;
  
  local_11 = SUB81((ulong)in_RAX >> 0x38,0);
  puVar1 = this->idx_ptr;
  this->idx_ptr = puVar1 + 1;
  offset = *puVar1;
  if (this->input_len <= offset) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"text ended prematurely");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  s = this->input;
  encountered = s[offset];
  if (encountered < 0x5b) {
    if (9 < encountered - 0x30) {
      if (encountered == 0x22) {
        pJVar2 = BlockAllocator<MercuryJson::JsonValue>::construct<MercuryJson::JsonValue,char*>
                           (&this->allocator,s + offset + 1);
        return pJVar2;
      }
      if (encountered != 0x2d) goto LAB_0010ee28;
    }
    args_00 = parse_number(s,&local_11,offset);
    if (local_11 == true) {
      args_01 = plain_convert(args_00);
      pJVar2 = BlockAllocator<MercuryJson::JsonValue>::construct<MercuryJson::JsonValue,double>
                         (&this->allocator,args_01);
    }
    else {
      pJVar2 = BlockAllocator<MercuryJson::JsonValue>::construct<MercuryJson::JsonValue,long_long>
                         (&this->allocator,args_00);
    }
    return pJVar2;
  }
  if (encountered < 0x6e) {
    if (encountered == 0x5b) {
      pJVar2 = _parse_array(this);
      return pJVar2;
    }
    if (encountered == 0x66) {
      args = parse_false(s,offset);
      goto LAB_0010edc6;
    }
  }
  else {
    if (encountered == 0x6e) {
      parse_null(s,offset);
      pJVar2 = BlockAllocator<MercuryJson::JsonValue>::construct<MercuryJson::JsonValue>
                         (&this->allocator);
      return pJVar2;
    }
    if (encountered == 0x74) {
      args = parse_true(s,offset);
LAB_0010edc6:
      pJVar2 = BlockAllocator<MercuryJson::JsonValue>::construct<MercuryJson::JsonValue,bool>
                         (&this->allocator,args);
      return pJVar2;
    }
    if (encountered == 0x7b) {
      pJVar2 = _parse_object(this);
      return pJVar2;
    }
  }
LAB_0010ee28:
  _error(this,"JSON value",encountered,offset);
}

Assistant:

JsonValue *JSON::_parse_value() {
        size_t idx;
        char ch;
        next_char();
        JsonValue *value;
        switch (ch) {
            case '"':
                value = allocator.construct(_parse_str(idx));
                break;
            case 't':
                value = allocator.construct(parse_true(input, idx));
                break;
            case 'f':
                value = allocator.construct(parse_false(input, idx));
                break;
            case 'n':
                parse_null(input, idx);
                value = allocator.construct();
                break;
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            case '-': {
                bool is_decimal;
                long long int ret = parse_number(input, &is_decimal, idx);
                if (is_decimal) value = allocator.construct(plain_convert(ret));
                else value = allocator.construct(ret);
                break;
            }
            case '[':
                value = _parse_array();
                break;
            case '{':
                value = _parse_object();
                break;
            default:
                error("JSON value");
        }
        return value;
    }